

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O1

bool __thiscall QMakeParser::readFile(QMakeParser *this,int id,ParseFlags flags,QString *contents)

{
  QMakeParserHandler *pQVar1;
  ReadResult RVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QArrayData *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  QString local_a0;
  QString local_88;
  type local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  RVar2 = QMakeVfs::readFile(this->m_vfs,id,contents,&local_58);
  if (((RVar2 != ReadOk) && (pQVar1 = this->m_handler, pQVar1 != (QMakeParserHandler *)0x0)) &&
     (RVar2 != ReadNotFound ||
      ((uint)flags.super_QFlagsStorageHelper<QMakeParser::ParseFlag,_4>.
             super_QFlagsStorage<QMakeParser::ParseFlag>.i & 4) != 0)) {
    QVar3.m_data = (storage_type *)0x12;
    QVar3.m_size = (qsizetype)&local_88;
    QString::fromLatin1(QVar3);
    QMakeVfs::fileNameForId(&local_a0,this->m_vfs,id);
    QString::arg<QString,QString&>(&local_70,&local_88,&local_a0,&local_58);
    local_b8 = (QArrayData *)0x0;
    uStack_b0 = 0;
    local_a8 = 0;
    (*(code *)**(undefined8 **)pQVar1)(pQVar1,0x300,&local_70,&local_b8,0);
    if (local_b8 != (QArrayData *)0x0) {
      LOCK();
      (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b8,2,0x10);
      }
    }
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return RVar2 == ReadOk;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeParser::readFile(int id, ParseFlags flags, QString *contents)
{
    QString errStr;
    QMakeVfs::ReadResult result = m_vfs->readFile(id, contents, &errStr);
    if (result != QMakeVfs::ReadOk) {
        if (m_handler && ((flags & ParseReportMissing) || result != QMakeVfs::ReadNotFound))
            m_handler->message(QMakeParserHandler::ParserIoError,
                               fL1S("Cannot read %1: %2").arg(m_vfs->fileNameForId(id), errStr));
        return false;
    }
    return true;
}